

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

ImageT<unsigned_int,_4U> * __thiscall
ImageT<unsigned_int,_4U>::swizzle(ImageT<unsigned_int,_4U> *this,string_view swizzle)

{
  Color *pCVar1;
  ulong uVar2;
  uint uVar3;
  uint32_t c;
  ulong uVar4;
  ulong uVar5;
  Color srcPixel;
  
  if (swizzle._M_len == 4) {
    for (uVar5 = 0; uVar5 < (this->super_Image).height * (this->super_Image).width;
        uVar5 = uVar5 + 1) {
      pCVar1 = this->pixels + uVar5;
      srcPixel.field_0.comps[0] = (pCVar1->field_0).comps[0];
      srcPixel.field_0.comps[1] = (pCVar1->field_0).comps[1];
      srcPixel.field_0.comps[2] = (pCVar1->field_0).comps[2];
      srcPixel.field_0.comps[3] = (pCVar1->field_0).comps[3];
      uVar4 = 0;
      while( true ) {
        uVar3 = (*(this->super_Image)._vptr_Image[5])(this);
        if (uVar3 <= uVar4) break;
        pCVar1 = this->pixels;
        uVar3 = swizzlePixel(this,&srcPixel,swizzle._M_str[uVar4]);
        uVar2 = 3;
        if ((uint)uVar4 < 3) {
          uVar2 = uVar4;
        }
        pCVar1[uVar5].field_0.comps[uVar2 & 0xffffffff] = uVar3;
        uVar4 = uVar4 + 1;
      }
    }
    return this;
  }
  __assert_fail("swizzle.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x4fe,
                "virtual ImageT<componentType, componentCount> &ImageT<unsigned int, 4>::swizzle(std::string_view) [componentType = unsigned int, componentCount = 4]"
               );
}

Assistant:

virtual ImageT& swizzle(std::string_view swizzle) override {
        assert(swizzle.size() == 4);
        for (size_t i = 0; i < getPixelCount(); i++) {
            Color srcPixel = pixels[i];
            for (uint32_t c = 0; c < getComponentCount(); c++) {
                pixels[i].set(c, swizzlePixel(srcPixel, swizzle[c]));
            }
        }
        return *this;
    }